

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O1

void * min_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  t_float tVar1;
  
  if (1 < argc) {
    post("min~: extra arguments ignored");
  }
  if (argc == 0) {
    owner = (t_object *)pd_new(min_class);
    inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
    outlet_new(owner,&s_signal);
    *(undefined4 *)&owner[1].te_g.g_pd = 0;
  }
  else {
    owner = (t_object *)pd_new(scalarmin_class);
    floatinlet_new(owner,(t_float *)(owner + 1));
    tVar1 = atom_getfloatarg(0,argc,argv);
    *(t_float *)&owner[1].te_g.g_pd = tVar1;
    outlet_new(owner,&s_signal);
    *(undefined4 *)((long)&owner[1].te_g.g_pd + 4) = 0;
  }
  return owner;
}

Assistant:

static void *min_new(t_symbol *s, int argc, t_atom *argv)
{
    if (argc > 1) post("min~: extra arguments ignored");
    if (argc)
    {
        t_scalarmin *x = (t_scalarmin *)pd_new(scalarmin_class);
        floatinlet_new(&x->x_obj, &x->x_g);
        x->x_g = atom_getfloatarg(0, argc, argv);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
    else
    {
        t_min *x = (t_min *)pd_new(min_class);
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
        outlet_new(&x->x_obj, &s_signal);
        x->x_f = 0;
        return (x);
    }
}